

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

XrResult ApiDumpLayerXrSubmitDebugUtilsMessageEXT
                   (XrInstance instance,XrDebugUtilsMessageSeverityFlagsEXT messageSeverity,
                   XrDebugUtilsMessageTypeFlagsEXT messageTypes,
                   XrDebugUtilsMessengerCallbackDataEXT *callbackData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  XrResult XVar5;
  iterator iVar6;
  invalid_argument *this;
  XrDebugUtilsMessageSeverityFlagsEXT XVar7;
  XrDebugUtilsMessageTypeFlagsEXT XVar8;
  char cVar9;
  string __str;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_instance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  XrInstance local_230;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  XrGeneratedDispatchTable *local_208;
  string local_200;
  string local_1e0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  unique_lock<std::mutex> local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_228.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_device = &g_instance_dispatch_mutex;
  local_1a8._M_owns = false;
  local_230 = instance;
  std::unique_lock<std::mutex>::lock(&local_1a8);
  local_1a8._M_owns = true;
  iVar6 = std::
          _Hashtable<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_instance_dispatch_map._M_h,&local_230);
  if (iVar6.
      super__Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    local_208 = *(XrGeneratedDispatchTable **)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>,_false>
                        ._M_cur + 0x10);
    std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[29],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_228,(char (*) [9])"XrResult",(char (*) [29])"xrSubmitDebugUtilsMessageEXT",
               (char (*) [1])0x29fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    lVar2 = *(long *)((long)&local_1a8._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_190 + lVar2) = *(uint *)((long)auStack_190 + lVar2) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[11],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_228,(char (*) [11])"XrInstance",(char (*) [9])"instance",&local_250);
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    cVar9 = '\x01';
    if (9 < messageSeverity) {
      XVar7 = messageSeverity;
      cVar3 = '\x04';
      do {
        cVar9 = cVar3;
        if (XVar7 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_002298ee;
        }
        if (XVar7 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_002298ee;
        }
        if (XVar7 < 10000) goto LAB_002298ee;
        bVar4 = 99999 < XVar7;
        XVar7 = XVar7 / 10000;
        cVar3 = cVar9 + '\x04';
      } while (bVar4);
      cVar9 = cVar9 + '\x01';
    }
LAB_002298ee:
    local_250._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_250._M_dataplus._M_p,(uint)local_250._M_string_length,messageSeverity);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[36],char_const(&)[16],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_228,(char (*) [36])"XrDebugUtilsMessageSeverityFlagsEXT",
               (char (*) [16])"messageSeverity",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    cVar9 = '\x01';
    if (9 < messageTypes) {
      XVar8 = messageTypes;
      cVar3 = '\x04';
      do {
        cVar9 = cVar3;
        if (XVar8 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_002299a0;
        }
        if (XVar8 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_002299a0;
        }
        if (XVar8 < 10000) goto LAB_002299a0;
        bVar4 = 99999 < XVar8;
        XVar8 = XVar8 / 10000;
        cVar3 = cVar9 + '\x04';
      } while (bVar4);
      cVar9 = cVar9 + '\x01';
    }
LAB_002299a0:
    local_250._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_250._M_dataplus._M_p,(uint)local_250._M_string_length,messageTypes);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[32],char_const(&)[13],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_228,(char (*) [32])"XrDebugUtilsMessageTypeFlagsEXT",
               (char (*) [13])"messageTypes",&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"callbackData","");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,"const XrDebugUtilsMessengerCallbackDataEXT*","");
    bVar4 = ApiDumpOutputXrStruct(local_208,callbackData,&local_1e0,&local_200,true,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1c0,&local_228);
    ApiDumpLayerRecordContent(&local_1c0);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1c0);
    XVar5 = (*local_208->SubmitDebugUtilsMessageEXT)
                      (local_230,messageSeverity,messageTypes,callbackData);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_228);
  return XVar5;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrSubmitDebugUtilsMessageEXT(
    XrInstance instance,
    XrDebugUtilsMessageSeverityFlagsEXT messageSeverity,
    XrDebugUtilsMessageTypeFlagsEXT messageTypes,
    const XrDebugUtilsMessengerCallbackDataEXT* callbackData) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
            auto map_iter = g_instance_dispatch_map.find(instance);
            if (map_iter == g_instance_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrSubmitDebugUtilsMessageEXT", "");
        std::ostringstream oss_instance;
        oss_instance << std::hex << reinterpret_cast<const void*>(instance);
        contents.emplace_back("XrInstance", "instance", oss_instance.str());
        contents.emplace_back("XrDebugUtilsMessageSeverityFlagsEXT", "messageSeverity", std::to_string(messageSeverity));
        contents.emplace_back("XrDebugUtilsMessageTypeFlagsEXT", "messageTypes", std::to_string(messageTypes));
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, callbackData, "callbackData", "const XrDebugUtilsMessengerCallbackDataEXT*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->SubmitDebugUtilsMessageEXT(instance, messageSeverity, messageTypes, callbackData);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}